

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void max_cb(Fl_Value_Input *i,void *v)

{
  double dVar1;
  Fl_Type *pFVar2;
  Fl_Type *this;
  bool bVar3;
  int iVar4;
  long lVar5;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar6;
  Fl_Image *v_00;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (iVar4 == 0) {
      iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1d])();
      if (iVar4 == 0) {
        Fl_Widget::deactivate((Fl_Widget *)i);
        return;
      }
      Fl_Widget::activate((Fl_Widget *)i);
      v_00 = current_widget->o[1].label_.image;
    }
    else {
      Fl_Widget::activate((Fl_Widget *)i);
      v_00 = (Fl_Image *)current_widget->o[1].user_data_;
    }
    Fl_Valuator::value(&i->super_Fl_Valuator,(double)v_00);
    return;
  }
  dVar1 = (i->super_Fl_Valuator).value_;
  bVar3 = false;
  ppFVar6 = &Fl_Type::first;
  do {
    pFVar2 = *ppFVar6;
    if (pFVar2 == (Fl_Type *)0x0) {
      if (bVar3) {
        set_modflag(1);
        return;
      }
      return;
    }
    if (pFVar2->selected != '\0') {
      iVar4 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
      if (iVar4 != 0) {
        iVar4 = (*pFVar2->_vptr_Fl_Type[0x1c])(pFVar2);
        lVar5 = 0x90;
        if (iVar4 == 0) {
          iVar4 = (*pFVar2->_vptr_Fl_Type[0x1d])(pFVar2);
          lVar5 = 0xb0;
          if (iVar4 == 0) goto LAB_00187579;
        }
        this = pFVar2[1].prev;
        *(double *)((long)&this->_vptr_Fl_Type + lVar5) = dVar1;
        Fl_Widget::redraw((Fl_Widget *)this);
        bVar3 = true;
      }
    }
LAB_00187579:
    ppFVar6 = &pFVar2->next;
  } while( true );
}

Assistant:

void max_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_valuator()) {
      i->activate();
      i->value(((Fl_Valuator*)(current_widget->o))->maximum());
    } else if (current_widget->is_spinner()) {
      i->activate();
      i->value(((Fl_Spinner*)(current_widget->o))->maximum());
    } else {
      i->deactivate();
      return;
    }
  } else {
    int mod = 0;
    double n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	if (q->is_valuator()) {
	  ((Fl_Valuator*)(q->o))->maximum(n);
	  q->o->redraw();
	  mod = 1;
        } else if (q->is_spinner()) {
          ((Fl_Spinner*)(q->o))->maximum(n);
          q->o->redraw();
          mod = 1;
	}
      }
    }
    if (mod) set_modflag(1);
  }
}